

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AlterForeignKeyInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::AlterForeignKeyType_const&>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_2,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *args_3,vector<duckdb::PhysicalIndex,_true> *args_4,
          vector<duckdb::PhysicalIndex,_true> *args_5,AlterForeignKeyType *args_6)

{
  vector<duckdb::PhysicalIndex,_true> fk_keys;
  AlterForeignKeyInfo *this_00;
  pointer in_stack_fffffffffffffed8;
  AlterForeignKeyType type_p;
  AlterForeignKeyInfo *pAVar1;
  _Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  _Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> local_d0;
  string local_b8;
  AlterEntryData local_98;
  
  this_00 = (AlterForeignKeyInfo *)operator_new(0x100);
  AlterEntryData::AlterEntryData(&local_98,args);
  ::std::__cxx11::string::string((string *)&local_b8,(string *)args_1);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_e8,
           &args_2->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  pAVar1 = this_00;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_100,
           &args_3->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  type_p = (AlterForeignKeyType)pAVar1;
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::vector
            ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)&local_118,
             &args_4->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>);
  ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::vector
            ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)&local_d0,
             &args_5->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>);
  fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = *args_6;
  fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_d0;
  fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffed8;
  AlterForeignKeyInfo::AlterForeignKeyInfo
            (this_00,&local_98,&local_b8,&local_e8,&local_100,
             (vector<duckdb::PhysicalIndex,_true> *)&local_118,fk_keys,type_p);
  *(AlterForeignKeyInfo **)this = this_00;
  ::std::_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::~_Vector_base
            (&local_d0);
  ::std::_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::~_Vector_base
            (&local_118);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_100);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  AlterEntryData::~AlterEntryData(&local_98);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}